

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseRuleset(Parser *this,StyleRule *styleRule)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> QVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  Symbol *pSVar12;
  long in_FS_OFFSET;
  Declaration decl;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> moved;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> local_88;
  Declaration local_80;
  QArrayDataPointer<QCss::BasicSelector> local_78;
  QArrayDataPointer<QCss::BasicSelector> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (BasicSelector *)0x0;
  local_58.size = 0;
  bVar1 = parseSelector(this,(Selector *)&local_58);
  if (bVar1) {
    QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
              ((QMovableArrayOps<QCss::Selector> *)styleRule,(styleRule->selectors).d.size,
               (Selector *)&local_58);
    QList<QCss::Selector>::end(&styleRule->selectors);
    iVar7 = this->index;
    lVar10 = (long)iVar7;
    lVar5 = (this->symbols).d.size;
    if (lVar10 < lVar5) {
      do {
        if ((this->symbols).d.ptr[lVar10].token != COMMA) break;
        this->index = iVar7 + 1;
        lVar11 = (long)(iVar7 + 1);
        lVar10 = lVar5 - lVar11;
        if (lVar10 != 0 && lVar11 <= lVar5) {
          iVar7 = iVar7 + 2;
          pSVar12 = (this->symbols).d.ptr + lVar11;
          do {
            if (pSVar12->token != S) break;
            this->index = iVar7;
            iVar7 = iVar7 + 1;
            pSVar12 = pSVar12 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        local_78.d = (Data *)0x0;
        local_78.ptr = (BasicSelector *)0x0;
        local_78.size = 0;
        bVar1 = testSimpleSelector(this);
        if (!bVar1) {
          this->errorIndex = this->index;
LAB_005f01b8:
          QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_78);
          goto LAB_005f0217;
        }
        bVar1 = parseSelector(this,(Selector *)&local_78);
        if (!bVar1) goto LAB_005f01b8;
        QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
                  ((QMovableArrayOps<QCss::Selector> *)styleRule,(styleRule->selectors).d.size,
                   (Selector *)&local_78);
        QList<QCss::Selector>::end(&styleRule->selectors);
        QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_78);
        iVar7 = this->index;
        lVar10 = (long)iVar7;
        lVar5 = (this->symbols).d.size;
      } while (lVar10 < lVar5);
    }
    iVar7 = this->index;
    lVar11 = (long)iVar7;
    lVar10 = lVar5 - lVar11;
    if (lVar10 != 0 && lVar11 <= lVar5) {
      pSVar12 = (this->symbols).d.ptr + lVar11;
      do {
        iVar7 = iVar7 + 1;
        if (pSVar12->token != S) break;
        this->index = iVar7;
        pSVar12 = pSVar12 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    iVar7 = this->index;
    if ((iVar7 < lVar5) && (this->index = iVar7 + 1, (this->symbols).d.ptr[iVar7].token == LBRACE))
    {
      iVar7 = this->index;
      bVar1 = false;
      do {
        lVar5 = (this->symbols).d.size;
        iVar8 = this->index;
        lVar11 = (long)iVar8;
        lVar10 = lVar5 - lVar11;
        if (lVar10 != 0 && lVar11 <= lVar5) {
          pSVar12 = (this->symbols).d.ptr + lVar11;
          do {
            iVar8 = iVar8 + 1;
            if (pSVar12->token != S) break;
            this->index = iVar8;
            pSVar12 = pSVar12 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        local_80.d.d.ptr =
             (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)&DAT_aaaaaaaaaaaaaaaa
        ;
        local_80.d.d.ptr =
             (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)operator_new(0x68);
        *(int *)local_80.d.d.ptr = 0;
        (((QString *)((long)local_80.d.d.ptr + 8))->d).d = (Data *)0x0;
        *(char16_t **)((long)local_80.d.d.ptr + 0x10) = (char16_t *)0x0;
        *(undefined8 *)((long)local_80.d.d.ptr + 0x14) = 0;
        ((int *)((long)local_80.d.d.ptr + 0x1c))[0] = 0;
        ((int *)((long)local_80.d.d.ptr + 0x1c))[1] = 0;
        (((QList<QCss::Value> *)((long)local_80.d.d.ptr + 0x28))->d).d = (Data *)0x0;
        *(Value **)((long)local_80.d.d.ptr + 0x30) = (Value *)0x0;
        *(qsizetype *)((long)local_80.d.d.ptr + 0x38) = 0;
        (((QVariant *)((long)local_80.d.d.ptr + 0x40))->d).data.shared = (PrivateShared *)0x0;
        *(qsizetype *)((long)local_80.d.d.ptr + 0x48) = 0;
        (((Data *)((long)local_80.d.d.ptr + 0x50))->super_QArrayData).ref_ = (Type)0x0;
        (((Data *)((long)local_80.d.d.ptr + 0x50))->super_QArrayData).flags =
             (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
        *(qsizetype *)((long)local_80.d.d.ptr + 0x58) = 2;
        *(byte *)&(((Data *)((long)local_80.d.d.ptr + 0x60))->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
             (byte)(((Data *)((long)local_80.d.d.ptr + 0x60))->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i & 0xfc;
        LOCK();
        *(int *)local_80.d.d.ptr = *(int *)local_80.d.d.ptr + 1;
        UNLOCK();
        iVar8 = this->index;
        bVar2 = parseNextDeclaration(this,&local_80);
        if (bVar2) {
LAB_005f0146:
          if ((*(qsizetype *)((long)local_80.d.d.ptr + 0x18) != 0) ||
             (*(Property *)((long)local_80.d.d.ptr + 0x20) != UnknownProperty)) {
            QtPrivate::QMovableArrayOps<QCss::Declaration>::emplace<QCss::Declaration_const&>
                      ((QMovableArrayOps<QCss::Declaration> *)&styleRule->declarations,
                       (styleRule->declarations).d.size,&local_80);
            QList<QCss::Declaration>::end(&styleRule->declarations);
          }
          bVar2 = true;
        }
        else {
          this->index = iVar8;
          bVar3 = until(this,SEMICOLON,NONE);
          iVar8 = this->index;
          this->index = iVar7;
          bVar4 = until(this,RBRACE,NONE);
          iVar9 = this->index;
          bVar2 = iVar9 <= iVar8;
          if (bVar2 || !bVar3) {
            lVar11 = (long)iVar9;
            lVar5 = (this->symbols).d.size;
            lVar10 = lVar5 - lVar11;
            bVar1 = bVar4;
            if (lVar10 != 0 && lVar11 <= lVar5) {
              pSVar12 = (this->symbols).d.ptr + lVar11;
              do {
                iVar9 = iVar9 + 1;
                if (pSVar12->token != S) break;
                this->index = iVar9;
                pSVar12 = pSVar12 + 1;
                lVar10 = lVar10 + -1;
              } while (lVar10 != 0);
            }
          }
          else {
            QVar6.d.ptr = (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)
                          operator_new(0x68);
            *(int *)QVar6.d.ptr = 0;
            (((QString *)((long)QVar6.d.ptr + 8))->d).d = (Data *)0x0;
            *(char16_t **)((long)QVar6.d.ptr + 0x10) = (char16_t *)0x0;
            *(undefined8 *)((long)QVar6.d.ptr + 0x14) = 0;
            ((int *)((long)QVar6.d.ptr + 0x1c))[0] = 0;
            ((int *)((long)QVar6.d.ptr + 0x1c))[1] = 0;
            (((QList<QCss::Value> *)((long)QVar6.d.ptr + 0x28))->d).d = (Data *)0x0;
            *(Value **)((long)QVar6.d.ptr + 0x30) = (Value *)0x0;
            *(qsizetype *)((long)QVar6.d.ptr + 0x38) = 0;
            (((QVariant *)((long)QVar6.d.ptr + 0x40))->d).data.shared = (PrivateShared *)0x0;
            *(qsizetype *)((long)QVar6.d.ptr + 0x48) = 0;
            (((Data *)((long)QVar6.d.ptr + 0x50))->super_QArrayData).ref_ = (Type)0x0;
            (((Data *)((long)QVar6.d.ptr + 0x50))->super_QArrayData).flags =
                 (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
            *(qsizetype *)((long)QVar6.d.ptr + 0x58) = 2;
            *(byte *)&(((Data *)((long)QVar6.d.ptr + 0x60))->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                 (byte)(((Data *)((long)QVar6.d.ptr + 0x60))->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i & 0xfc;
            LOCK();
            *(int *)QVar6.d.ptr = *(int *)QVar6.d.ptr + 1;
            UNLOCK();
            local_88.d.ptr =
                 (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)
                 (DeclarationData *)0x0;
            local_78.d = (Data *)local_80.d.d.ptr;
            local_80.d.d.ptr =
                 (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
                 (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)QVar6.d.ptr;
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)&local_78
                      );
            QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
            ~QExplicitlySharedDataPointer(&local_88);
            this->index = iVar8 + -1;
          }
          if (!bVar2 && bVar3) goto LAB_005f0146;
          bVar2 = false;
        }
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::
        ~QExplicitlySharedDataPointer(&local_80.d);
        if (!bVar2) goto LAB_005f0219;
        iVar8 = this->index;
        lVar5 = (this->symbols).d.size;
        if ((lVar5 <= iVar8) || ((this->symbols).d.ptr[iVar8].token != SEMICOLON))
        goto LAB_005f01c4;
        this->index = iVar8 + 1;
      } while( true );
    }
    goto LAB_005f0211;
  }
  goto LAB_005f0217;
LAB_005f01c4:
  iVar7 = this->index;
  if ((iVar7 < lVar5) && (this->index = iVar7 + 1, (this->symbols).d.ptr[iVar7].token == RBRACE)) {
    iVar7 = this->index;
    lVar11 = (long)iVar7;
    bVar1 = true;
    lVar10 = lVar5 - lVar11;
    if (lVar10 != 0 && lVar11 <= lVar5) {
      pSVar12 = (this->symbols).d.ptr + lVar11;
      do {
        iVar7 = iVar7 + 1;
        if (pSVar12->token != S) break;
        this->index = iVar7;
        pSVar12 = pSVar12 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    goto LAB_005f0219;
  }
LAB_005f0211:
  this->errorIndex = this->index;
LAB_005f0217:
  bVar1 = false;
LAB_005f0219:
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool Parser::parseRuleset(StyleRule *styleRule)
{
    Selector sel;
    if (!parseSelector(&sel)) return false;
    styleRule->selectors.append(sel);

    while (test(COMMA)) {
        skipSpace();
        Selector sel;
        if (!parseNextSelector(&sel)) return false;
        styleRule->selectors.append(sel);
    }

    skipSpace();
    if (!next(LBRACE)) return false;
    const int declarationStart = index;

    do {
        skipSpace();
        Declaration decl;
        const int rewind = index;
        if (!parseNextDeclaration(&decl)) {
            index = rewind;
            const bool foundSemicolon = until(SEMICOLON);
            const int semicolonIndex = index;

            index = declarationStart;
            const bool foundRBrace = until(RBRACE);

            if (foundSemicolon && semicolonIndex < index) {
                decl = Declaration();
                index = semicolonIndex - 1;
            } else {
                skipSpace();
                return foundRBrace;
            }
        }
        if (!decl.isEmpty())
            styleRule->declarations.append(decl);
    } while (test(SEMICOLON));

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}